

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

Iterator * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++(Iterator *this)

{
  bool bVar1;
  reference ppNVar2;
  pair<phosg::Vector2<long>,_long> local_30;
  value_type local_18;
  Node *n;
  Iterator *this_local;
  
  n = (Node *)this;
  ppNVar2 = ::std::
            deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ::front(&this->pending);
  local_18 = *ppNVar2;
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::pop_front(&this->pending);
  if (local_18->before != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&local_18->before);
  }
  if (local_18->after_or_equal != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&local_18->after_or_equal);
  }
  bVar1 = ::std::
          deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
          ::empty(&this->pending);
  if (!bVar1) {
    ppNVar2 = ::std::
              deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ::front(&this->pending);
    local_18 = *ppNVar2;
    ::std::make_pair<phosg::Vector2<long>const&,long_const&>
              (&local_30,&local_18->pt,&local_18->value);
    ::std::pair<phosg::Vector2<long>,_long>::operator=(&this->current,&local_30);
  }
  return this;
}

Assistant:

typename KDTree<CoordType, ValueType>::Iterator&
KDTree<CoordType, ValueType>::Iterator::operator++() {
  const Node* n = this->pending.front();
  this->pending.pop_front();

  if (n->before) {
    this->pending.emplace_back(n->before);
  }
  if (n->after_or_equal) {
    this->pending.emplace_back(n->after_or_equal);
  }

  if (!this->pending.empty()) {
    n = this->pending.front();
    this->current = std::make_pair(n->pt, n->value);
  }

  return *this;
}